

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

void absl::lts_20250127::functional_internal::
     InvokeObject<absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatFPositiveExpSlow(absl::lts_20250127::uint128,int,absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatState_const&)::__0,void,absl::lts_20250127::str_format_internal::(anonymous_namespace)::BinaryToDecimal>
               (VoidPtr ptr,type args)

{
  FormatState *state;
  ulong uVar1;
  uint uVar2;
  char *pcVar3;
  reference puVar4;
  long lVar5;
  size_t sVar6;
  string_view v;
  size_t local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  size_t local_68;
  Span<unsigned_int> SStack_60;
  Padding local_48;
  
  local_88 = args->decimal_start_;
  uStack_80 = args->decimal_end_;
  local_78 = *(undefined8 *)(args->digits_)._M_elems;
  uStack_70 = *(undefined8 *)((args->digits_)._M_elems + 8);
  sVar6 = args->size_;
  SStack_60.ptr_ = (args->data_).ptr_;
  SStack_60.len_ = (args->data_).len_;
  state = *ptr.obj;
  if ((state->precision == 0) && ((state->conv->flags_ & kAlt) == kBasic)) {
    lVar5 = 0;
  }
  else {
    lVar5 = state->precision + 1;
  }
  local_68 = sVar6;
  str_format_internal::anon_unknown_0::ExtraWidthToPadding
            (&local_48,
             ((uStack_80 - local_88) * 9 + sVar6 + lVar5 + 1) - (ulong)(state->sign_char == '\0'),
             state);
  str_format_internal::FormatSinkImpl::Append(state->sink,local_48.left_spaces,' ');
  pcVar3 = *ptr.obj;
  if (*pcVar3 != '\0') {
    str_format_internal::FormatSinkImpl::Append(*(FormatSinkImpl **)(pcVar3 + 0x18),1,*pcVar3);
    pcVar3 = *ptr.obj;
  }
  str_format_internal::FormatSinkImpl::Append
            (*(FormatSinkImpl **)(pcVar3 + 0x18),local_48.zeros,'0');
  while (v._M_str = (char *)((long)&uStack_70 + (1 - sVar6)), v._M_len = sVar6,
        str_format_internal::FormatSinkImpl::Append(*(FormatSinkImpl **)(*ptr.obj + 0x18),v),
        sVar6 = local_88, local_88 < uStack_80) {
    local_88 = local_88 + 1;
    puVar4 = Span<unsigned_int>::operator[](&SStack_60,sVar6);
    uVar2 = *puVar4;
    for (lVar5 = 0x18; lVar5 != 0xf; lVar5 = lVar5 + -1) {
      uVar1 = (ulong)uVar2;
      uVar2 = uVar2 / 10;
      *(byte *)((long)&local_88 + lVar5) = (byte)(uVar1 % 10) | 0x30;
    }
    local_68 = 9;
    sVar6 = 9;
  }
  lVar5 = *ptr.obj;
  if ((*(long *)(lVar5 + 8) == 0) && ((*(byte *)(*(long *)(lVar5 + 0x10) + 1) & 8) == 0)) {
    sVar6 = 0;
  }
  else {
    str_format_internal::FormatSinkImpl::Append(*(FormatSinkImpl **)(lVar5 + 0x18),1,'.');
    lVar5 = *ptr.obj;
    sVar6 = *(size_t *)(lVar5 + 8);
  }
  str_format_internal::FormatSinkImpl::Append(*(FormatSinkImpl **)(lVar5 + 0x18),sVar6,'0');
  str_format_internal::FormatSinkImpl::Append
            (*(FormatSinkImpl **)(*ptr.obj + 0x18),local_48.right_spaces,' ');
  return;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}